

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtOptimizedBvhNode>::initializeFromBuffer
          (cbtAlignedObjectArray<cbtOptimizedBvhNode> *this,void *buffer,int size,int capacity)

{
  clear(this);
  this->m_ownsMemory = false;
  this->m_data = (cbtOptimizedBvhNode *)buffer;
  this->m_size = size;
  this->m_capacity = capacity;
  return;
}

Assistant:

void initializeFromBuffer(void* buffer, int size, int capacity)
	{
		clear();
		m_ownsMemory = false;
		m_data = (T*)buffer;
		m_size = size;
		m_capacity = capacity;
	}